

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

void __thiscall CSegment::CSegment(CSegment *this)

{
  CSegment *this_local;
  
  CObject::CObject(&this->super_CObject);
  (this->super_CObject)._vptr_CObject = (_func_int **)&PTR__CSegment_001cdd00;
  this->m_pPointE = (CPoint *)0x0;
  this->m_pPointS = (CPoint *)0x0;
  return;
}

Assistant:

CSegment::CSegment()
{
	//m_cWidth	=	0;
	m_pPointE	=	NULL;
	m_pPointS	=	NULL;

#ifdef _DEBUG
	m_iNumInstance++;
#endif
}